

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4,bool relaxed)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  CompilerError *this_00;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  byte bVar4;
  char *local_130;
  undefined1 local_122;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_121;
  uint local_fc;
  undefined1 local_f8 [4];
  uint32_t c;
  undefined1 local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long local_70;
  size_type end_deferred_index;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  size_type column_index;
  bool relaxed_local;
  bool param_4_local;
  uint32_t param_3_local;
  SPIRType *exp_type_local;
  string *exp_str_local;
  CompilerGLSL *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *transposed_expr;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression(this,exp_str);
  bVar1 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (bVar1) {
    if ((this->options).version < 0x78) {
      if ((exp_type->vecsize == 2) && (exp_type->columns == 2)) {
        require_polyfill(this,PolyfillTranspose2x2,relaxed);
      }
      else if ((exp_type->vecsize == 3) && (exp_type->columns == 3)) {
        require_polyfill(this,PolyfillTranspose3x3,relaxed);
      }
      else {
        if ((exp_type->vecsize != 4) || (exp_type->columns != 4)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Non-square matrices are not supported in legacy GLSL, cannot transpose.");
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        require_polyfill(this,PolyfillTranspose4x4,relaxed);
      }
      bVar4 = 0;
      if (((this->options).es & 1U) != 0) {
        bVar4 = relaxed;
      }
      local_130 = "";
      if ((bVar4 & 1) != 0) {
        local_130 = "MP";
      }
      join<char_const(&)[13],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x4aadc7,(char (*) [13])&local_130,
                 (char **)0x4a488c,(char (*) [2])exp_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                 (char (*) [2])CONCAT17(bVar4,in_stack_fffffffffffffe88));
    }
    else {
      join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x496f3d,(char (*) [11])exp_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,ts_2)
      ;
    }
  }
  else {
    column_expr.field_2._8_8_ = ::std::__cxx11::string::find_last_of((char)exp_str,0x5b);
    if (column_expr.field_2._8_8_ == -1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)exp_str);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_58,(ulong)exp_str);
      ::std::__cxx11::string::resize((ulong)exp_str);
      local_70 = ::std::__cxx11::string::find_last_of((char)local_58,0x5d);
      if ((local_70 != -1) &&
         (lVar2 = local_70 + 1, lVar3 = ::std::__cxx11::string::size(), lVar2 != lVar3)) {
        local_70 = local_70 + 1;
        ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_58);
        ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_58);
        ::std::operator+(&local_90,&local_b0,&local_d0);
        ::std::__cxx11::string::operator=(local_58,(string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_b0);
      }
      local_d1 = 0;
      type_to_glsl_constructor_abi_cxx11_((string *)local_f8,this,exp_type);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,"(");
      ::std::__cxx11::string::~string((string *)local_f8);
      for (local_fc = 0; local_fc < exp_type->vecsize; local_fc = local_fc + 1) {
        local_121._M_dataplus = (_Alloc_hider)0x5b;
        local_122 = 0x5d;
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  ((string *)&local_121.field_0x1,(spirv_cross *)exp_str,&local_121,
                   (char *)&local_fc,(uint *)&local_122,(char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        ::std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,(string *)&local_121.field_0x1);
        ::std::__cxx11::string::~string((string *)&local_121.field_0x1);
        if (local_fc + 1 < exp_type->vecsize) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      local_d1 = 1;
      ::std::__cxx11::string::~string(local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/, bool relaxed)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto end_deferred_index = column_expr.find_last_of(']');
		if (end_deferred_index != string::npos && end_deferred_index + 1 != column_expr.size())
		{
			// If we have any data member fixups, it must be transposed so that it refers to this index.
			// E.g. [0].data followed by [1] would be shuffled to [1][0].data which is wrong,
			// and needs to be [1].data[0] instead.
			end_deferred_index++;
			column_expr = column_expr.substr(end_deferred_index) +
			              column_expr.substr(0, end_deferred_index);
		}

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
			require_polyfill(PolyfillTranspose2x2, relaxed);
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
			require_polyfill(PolyfillTranspose3x3, relaxed);
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
			require_polyfill(PolyfillTranspose4x4, relaxed);
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose", (options.es && relaxed) ? "MP" : "", "(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}